

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::PutVal
          (TPZBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col,
          complex<float> *value)

{
  float fVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = (this->fBlockSize).fNElements;
  if (lVar3 == 0) {
    pcVar4 = "TPZBlockDiagonal::PutVal called with parameters out of range\n";
    lVar3 = 0x3d;
  }
  else {
    lVar2 = 0;
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar6 = lVar2;
      lVar5 = (long)(this->fBlockSize).fStore[lVar6];
      lVar8 = lVar7 + lVar5;
      if (lVar3 <= lVar6) break;
      lVar2 = lVar6 + 1;
    } while (lVar8 <= row);
    if (lVar3 + 1 == lVar6 + 1) {
      pcVar4 = "TPZBlockDiagonal::PutVal wrong data structure\n";
      lVar3 = 0x2e;
    }
    else {
      if (lVar7 <= col && col < lVar8) {
        (this->fStorage).fStore
        [(row - lVar7) + (this->fBlockPos).fStore[lVar6] + (col - lVar7) * lVar5]._M_value =
             value->_M_value;
        return 0;
      }
      if ((((*(float *)&value->_M_value == 0.0) && (!NAN(*(float *)&value->_M_value))) &&
          (fVar1 = *(float *)((long)&value->_M_value + 4), fVar1 == 0.0)) && (!NAN(fVar1))) {
        return 0;
      }
      pcVar4 = "TPZBlockDiagonal::PutVal, indices row col out of range\n";
      lVar3 = 0x37;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  return -1;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}